

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O0

void Eso_ManCoverPrint(Eso_Man_t *p,Vec_Int_t *vEsop)

{
  char Entry;
  int iVar1;
  int i_00;
  Vec_Str_t *p_00;
  char *pcVar2;
  Vec_Int_t *p_01;
  int Cube;
  int Lit;
  int k;
  int i;
  Vec_Int_t *vCube;
  Vec_Str_t *vStr;
  Vec_Int_t *vEsop_local;
  Eso_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vEsop);
  if (iVar1 == 0) {
    printf("Const 0\n");
  }
  else {
    p_00 = Vec_StrAlloc(p->nVars + 4);
    Vec_StrFill(p_00,p->nVars,'-');
    Vec_StrPush(p_00,' ');
    Vec_StrPush(p_00,'1');
    Vec_StrPush(p_00,'\n');
    Vec_StrPush(p_00,'\0');
    iVar1 = Vec_IntSize(vEsop);
    if (iVar1 < 1) {
      __assert_fail("Vec_IntSize(vEsop) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEsop.c"
                    ,0x80,"void Eso_ManCoverPrint(Eso_Man_t *, Vec_Int_t *)");
    }
    for (Lit = 0; iVar1 = Vec_IntSize(vEsop), Lit < iVar1; Lit = Lit + 1) {
      iVar1 = Vec_IntEntry(vEsop,Lit);
      if (iVar1 == p->Cube1) {
        pcVar2 = Vec_StrArray(p_00);
        printf("%s",pcVar2);
      }
      else {
        p_01 = Eso_ManCube(p,iVar1);
        for (Cube = 0; iVar1 = Vec_IntSize(p_01), Cube < iVar1; Cube = Cube + 1) {
          iVar1 = Vec_IntEntry(p_01,Cube);
          i_00 = Abc_Lit2Var(iVar1);
          iVar1 = Abc_LitIsCompl(iVar1);
          Entry = '1';
          if (iVar1 != 0) {
            Entry = '0';
          }
          Vec_StrWriteEntry(p_00,i_00,Entry);
        }
        pcVar2 = Vec_StrArray(p_00);
        printf("%s",pcVar2);
        for (Cube = 0; iVar1 = Vec_IntSize(p_01), Cube < iVar1; Cube = Cube + 1) {
          iVar1 = Vec_IntEntry(p_01,Cube);
          iVar1 = Abc_Lit2Var(iVar1);
          Vec_StrWriteEntry(p_00,iVar1,'-');
        }
      }
    }
    printf("\n");
    Vec_StrFree(p_00);
  }
  return;
}

Assistant:

void Eso_ManCoverPrint( Eso_Man_t * p, Vec_Int_t * vEsop )
{
    Vec_Str_t * vStr;
    Vec_Int_t * vCube;
    int i, k, Lit, Cube;
    if ( Vec_IntSize(vEsop) == 0 )
    {
        printf( "Const 0\n" );
        return;
    }
    vStr = Vec_StrAlloc( p->nVars + 4 );
    Vec_StrFill( vStr, p->nVars, '-' );
    Vec_StrPush( vStr, ' ' );
    Vec_StrPush( vStr, '1' );
    Vec_StrPush( vStr, '\n' );
    Vec_StrPush( vStr, '\0' );
    assert( Vec_IntSize(vEsop) > 0 );
    Vec_IntForEachEntry( vEsop, Cube, i )
    {
        if ( Cube == p->Cube1 )
            printf( "%s", Vec_StrArray(vStr) );
        else 
        {
            vCube = Eso_ManCube( p, Cube );
            Vec_IntForEachEntry( vCube, Lit, k )
                Vec_StrWriteEntry( vStr, Abc_Lit2Var(Lit), (char)(Abc_LitIsCompl(Lit)?'0':'1') );
            printf( "%s", Vec_StrArray(vStr) );
            Vec_IntForEachEntry( vCube, Lit, k )
                Vec_StrWriteEntry( vStr, Abc_Lit2Var(Lit), '-' );
        }
    }
    printf( "\n" );
    Vec_StrFree( vStr );
}